

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

void TargetFilesystemArtifactDependencyCMP0112::AddDependency
               (cmGeneratorTarget *target,cmGeneratorExpressionContext *context)

{
  bool bVar1;
  PolicyStatus PVar2;
  cmMakefile *this;
  string *args;
  cmake *this_00;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar3;
  string local_a8;
  undefined1 local_88 [8];
  string err;
  allocator<char> local_51;
  string local_50;
  cmLocalGenerator *local_30;
  cmLocalGenerator *lg;
  undefined1 local_20;
  cmGeneratorExpressionContext *local_18;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  
  local_18 = context;
  context_local = (cmGeneratorExpressionContext *)target;
  pVar3 = std::
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          ::insert(&context->AllTargets,(value_type *)&context_local);
  lg = (cmLocalGenerator *)pVar3.first._M_node;
  local_20 = pVar3.second;
  local_30 = local_18->LG;
  PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0112((cmGeneratorTarget *)context_local);
  if (PVar2 != OLD) {
    if (PVar2 != WARN) {
      return;
    }
    this = cmLocalGenerator::GetMakefile(local_30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"CMAKE_POLICY_WARNING_CMP0112",&local_51);
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_a8,(cmPolicies *)0x70,id);
      args = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)context_local);
      cmStrCat<std::__cxx11::string,char_const(&)[39],std::__cxx11::string_const&,char_const(&)[3]>
                ((string *)local_88,&local_a8,
                 (char (*) [39])"\nDependency being added to target:\n  \"",args,
                 (char (*) [3])0x1031b96);
      std::__cxx11::string::~string((string *)&local_a8);
      this_00 = cmLocalGenerator::GetCMakeInstance(local_30);
      cmake::IssueMessage(this_00,AUTHOR_WARNING,(string *)local_88,&local_18->Backtrace);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  std::
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>::
  insert(&local_18->DependTargets,(value_type *)&context_local);
  return;
}

Assistant:

static void AddDependency(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context)
  {
    context->AllTargets.insert(target);
    cmLocalGenerator* lg = context->LG;
    switch (target->GetPolicyStatusCMP0112()) {
      case cmPolicies::WARN:
        if (lg->GetMakefile()->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0112")) {
          std::string err =
            cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0112),
                     "\nDependency being added to target:\n  \"",
                     target->GetName(), "\"\n");
          lg->GetCMakeInstance()->IssueMessage(MessageType ::AUTHOR_WARNING,
                                               err, context->Backtrace);
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        context->DependTargets.insert(target);
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        break;
    }
  }